

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  uint uVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImDrawList *this;
  
  pIVar2 = GImGui;
  if ((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
       (GImGui->HoveredIdAllowOverlap == true)) &&
      (window = GImGui->CurrentWindow, GImGui->HoveredWindow == window)) &&
     ((GImGui->ActiveId == id || GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap == true))))
  {
    bVar3 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar3) {
      uVar1 = (&pIVar2->CurrentItemFlags)[(ulong)((pIVar2->LastItemData).ID == id) * 8];
      if (((uVar1 >> 8 & 1) != 0) || (bVar3 = IsWindowContentHoverable(window,0), bVar3)) {
        if (id == 0) {
          if ((uVar1 & 4) == 0) goto LAB_001c0110;
        }
        else {
          SetHoveredID(id);
          if ((uVar1 & 4) == 0) {
            if ((pIVar2->DebugItemPickerActive == true) && (pIVar2->HoveredIdPreviousFrame == id)) {
              this = GetForegroundDrawList();
              ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
            }
LAB_001c0110:
            return (bool)(pIVar2->NavDisableMouseHover ^ 1);
          }
        }
        if (pIVar2->ActiveId == id) {
          ClearActiveID();
        }
      }
      pIVar2->HoveredIdDisabled = true;
    }
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;

    // Done with rectangle culling so we can perform heavier checks now.
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (!(item_flags & ImGuiItemFlags_NoWindowHoverableCheck) && !IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we performed the test in ItemAdd(), but that would incur a small runtime cost.
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        //if (g.DebugItemPickerBreakId == id)
        //    IM_DEBUG_BREAK();
    }

    if (g.NavDisableMouseHover)
        return false;

    return true;
}